

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_button_symbol_text_styled
                  (nk_context *ctx,nk_style_button *style,nk_symbol_type symbol,char *text,int len,
                  nk_flags align)

{
  nk_rect bounds_00;
  nk_widget_layout_states nVar1;
  nk_command_buffer *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  nk_symbol_type in_R8D;
  nk_button_behavior unaff_retaddr;
  nk_style_button *in_stack_00000008;
  nk_user_font *in_stack_00000010;
  nk_input *in_stack_00000018;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_context *in_stack_ffffffffffffffa0;
  nk_rect *in_stack_ffffffffffffffa8;
  undefined8 uVar2;
  char *str;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar3;
  float in_stack_ffffffffffffffe8;
  nk_bool local_14;
  
  uVar3 = (undefined4)((ulong)in_RSI >> 0x20);
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) {
    local_14 = 0;
  }
  else {
    str = *(char **)(in_RDI + 0x40d8);
    uVar2 = *(undefined8 *)(str + 0xa8);
    nVar1 = nk_widget(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (nVar1 == NK_WIDGET_INVALID) {
      local_14 = 0;
    }
    else {
      bounds_00.y = (float)(int)in_RDI;
      bounds_00.w = (float)(int)((ulong)in_RDI >> 0x20);
      bounds_00.x = (float)uVar3;
      bounds_00.h = in_stack_ffffffffffffffe8;
      local_14 = nk_do_button_text_symbol
                           ((nk_flags *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX,bounds_00,
                            in_R8D,str,(int)((ulong)uVar2 >> 0x20),(nk_flags)uVar2,unaff_retaddr,
                            in_stack_00000008,in_stack_00000010,in_stack_00000018);
    }
  }
  return local_14;
}

Assistant:

NK_API nk_bool
nk_button_symbol_text_styled(struct nk_context *ctx,
const struct nk_style_button *style, enum nk_symbol_type symbol,
const char *text, int len, nk_flags align)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_button_text_symbol(&ctx->last_widget_state, &win->buffer, bounds,
symbol, text, len, align, ctx->button_behavior,
style, ctx->style.font, in);
}